

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_copySequencesToSeqStoreNoBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize)

{
  BYTE **ppBVar1;
  BYTE *pBVar2;
  undefined8 *puVar3;
  uint uVar4;
  ZSTD_CDict *pZVar5;
  ZSTD_compressedBlockState_t *pZVar6;
  BYTE *pBVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  seqDef *psVar11;
  undefined8 *puVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint *puVar21;
  ulong uVar22;
  undefined8 *puVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  BYTE *pBVar28;
  uint local_84;
  undefined8 local_80;
  uint local_78;
  uint local_74;
  uint local_70;
  int local_6c;
  ulong local_68;
  size_t local_60;
  size_t local_58;
  undefined8 *local_50;
  long local_48;
  ZSTD_Sequence *local_40;
  size_t local_38;
  
  uVar19 = (int)blockSize + seqPos->posInSequence;
  pZVar5 = cctx->cdict;
  if (pZVar5 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict == (void *)0x0) {
      local_60 = 0;
      goto LAB_001bb5b7;
    }
    pZVar5 = (ZSTD_CDict *)&cctx->prefixDict;
  }
  local_60 = pZVar5->dictContentSize;
LAB_001bb5b7:
  uVar15 = seqPos->idx;
  local_48 = (long)src + blockSize;
  pZVar6 = (cctx->blockState).prevCBlock;
  local_78 = pZVar6->rep[2];
  local_80 = *(ulong *)pZVar6->rep;
  if (uVar19 == 0) {
    uVar14 = 0;
    uVar27 = 0;
  }
  else {
    local_50 = (undefined8 *)(local_48 - 0x20);
    local_84 = 0;
    uVar26 = (ulong)seqPos->posInSequence;
    iVar16 = 0;
    local_70 = local_78;
    do {
      uVar14 = local_84;
      uVar27 = uVar19;
      local_78 = local_70;
      if ((iVar16 != 0) || (uVar17 = (ulong)uVar15, inSeqsSize <= uVar17)) goto LAB_001bb9d1;
      uVar10 = inSeqs[uVar17].offset;
      uVar22 = (ulong)uVar10;
      uVar4 = inSeqs[uVar17].litLength;
      uVar24 = inSeqs[uVar17].matchLength;
      uVar9 = uVar24 + uVar4;
      uVar20 = uVar9 - uVar19;
      uVar25 = (uint)uVar26;
      if (uVar9 < uVar19 || uVar20 == 0) {
        iVar16 = uVar25 - uVar4;
        if (uVar25 < uVar4) {
          iVar16 = 0;
        }
        uVar24 = uVar24 - iVar16;
        uVar13 = uVar4 - uVar25;
        local_6c = 0;
        if (uVar4 < uVar25) {
          uVar13 = 0;
        }
        uVar15 = uVar15 + 1;
        local_68 = 0;
      }
      else {
        uVar9 = uVar19 - uVar4;
        if (uVar19 < uVar4 || uVar9 == 0) goto LAB_001bb9d1;
        uVar13 = uVar4 - uVar25;
        if (uVar4 < uVar25) {
          uVar13 = 0;
        }
        uVar14 = uVar9;
        uVar27 = uVar4;
        if (uVar24 <= blockSize) goto LAB_001bb9d1;
        uVar24 = (uVar19 - uVar25) - uVar13;
        uVar4 = (cctx->appliedParams).cParams.minMatch;
        if (uVar24 < uVar4) goto LAB_001bb9d1;
        uVar9 = uVar4 - uVar20;
        if (uVar4 >= uVar20 && uVar9 != 0) {
          local_84 = uVar9;
        }
        if (uVar4 < uVar20) {
          uVar9 = 0;
        }
        uVar24 = uVar24 - uVar9;
        local_6c = 1;
        local_68 = uVar26;
      }
      uVar26 = local_80 & 0xffffffff;
      uVar14 = 0;
      uVar27 = (uint)(uVar13 == 0);
      if ((uint)local_80 == uVar10 && uVar13 != 0) {
LAB_001bb716:
        uVar27 = uVar27 + uVar14;
        if (uVar27 == 0) {
          uVar26 = local_80 >> 0x20;
          puVar21 = &local_78;
          uVar22 = local_80;
        }
        else {
          if (uVar27 == 3) {
            uVar10 = (uint)local_80 - 1;
          }
          else {
            uVar10 = *(uint *)((long)&local_80 + (ulong)uVar27 * 4);
          }
          uVar26 = local_80 & 0xffffffff;
          uVar22 = (ulong)uVar10;
          puVar21 = (uint *)((long)&local_80 + 4);
          if (uVar27 == 1) {
            puVar21 = &local_78;
          }
        }
      }
      else {
        iVar16 = 2;
        if ((local_80._4_4_ == uVar10) || (iVar16 = 3, local_70 == uVar10)) {
          uVar14 = ~uVar27 + iVar16;
          goto LAB_001bb716;
        }
        uVar14 = 2;
        if (((uint)local_80 - 1 == uVar10 && uVar13 == 0) || (uVar14 = uVar10 + 2, uVar14 < 3))
        goto LAB_001bb716;
        puVar21 = (uint *)((long)&local_80 + 4);
      }
      local_70 = *puVar21;
      local_80 = uVar22 & 0xffffffff | uVar26 << 0x20;
      local_78 = local_70;
      if ((cctx->appliedParams).validateSequences != 0) {
        uVar17 = (ulong)(uVar13 + uVar24) + seqPos->posInSrc;
        seqPos->posInSrc = uVar17;
        uVar22 = 1L << ((byte)(cctx->appliedParams).cParams.windowLog & 0x3f);
        uVar26 = local_60 + uVar17;
        if (uVar22 < uVar17) {
          uVar26 = uVar22;
        }
        if (uVar24 < (cctx->appliedParams).cParams.minMatch) {
          return 0xffffffffffffffec;
        }
        if (uVar26 + 2 < (ulong)uVar14) {
          return 0xffffffffffffffec;
        }
      }
      if ((cctx->seqStore).maxNbSeq < (ulong)(uVar15 - seqPos->idx)) {
        return 0xffffffffffffffc0;
      }
      uVar26 = (ulong)uVar13;
      puVar12 = (undefined8 *)((long)src + uVar26);
      pBVar7 = (cctx->seqStore).lit;
      if (local_50 < puVar12) {
        puVar23 = (undefined8 *)src;
        pBVar28 = pBVar7;
        if (src <= local_50) {
          pBVar28 = pBVar7 + ((long)local_50 - (long)src);
          uVar8 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar7 = *src;
          *(undefined8 *)(pBVar7 + 8) = uVar8;
          puVar23 = local_50;
          if (0x10 < (long)local_50 - (long)src) {
            lVar18 = 0x10;
            do {
              uVar8 = ((undefined8 *)((long)src + lVar18))[1];
              pBVar2 = pBVar7 + lVar18;
              *(undefined8 *)pBVar2 = *(undefined8 *)((long)src + lVar18);
              *(undefined8 *)(pBVar2 + 8) = uVar8;
              puVar3 = (undefined8 *)((long)src + lVar18 + 0x10);
              uVar8 = puVar3[1];
              *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
              *(undefined8 *)(pBVar2 + 0x18) = uVar8;
              lVar18 = lVar18 + 0x20;
            } while (pBVar2 + 0x20 < pBVar28);
          }
        }
        if (puVar23 < puVar12) {
          lVar18 = 0;
          do {
            pBVar28[lVar18] = *(BYTE *)((long)puVar23 + lVar18);
            lVar18 = lVar18 + 1;
          } while ((long)puVar12 - (long)puVar23 != lVar18);
        }
LAB_001bb920:
        ppBVar1 = &(cctx->seqStore).lit;
        *ppBVar1 = *ppBVar1 + uVar26;
        psVar11 = (cctx->seqStore).sequences;
        if (0xffff < uVar13) {
          (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
          (cctx->seqStore).longLengthPos =
               (U32)((ulong)((long)psVar11 - (long)(cctx->seqStore).sequencesStart) >> 3);
        }
      }
      else {
        uVar8 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar7 = *src;
        *(undefined8 *)(pBVar7 + 8) = uVar8;
        if (0x10 < uVar13) {
          pBVar7 = (cctx->seqStore).lit;
          uVar8 = *(undefined8 *)((long)src + 0x18);
          *(undefined8 *)(pBVar7 + 0x10) = *(undefined8 *)((long)src + 0x10);
          *(undefined8 *)(pBVar7 + 0x18) = uVar8;
          if (0x10 < uVar26 - 0x10) {
            lVar18 = 0;
            do {
              puVar12 = (undefined8 *)((long)src + lVar18 + 0x20);
              uVar8 = puVar12[1];
              pBVar28 = pBVar7 + lVar18 + 0x20;
              *(undefined8 *)pBVar28 = *puVar12;
              *(undefined8 *)(pBVar28 + 8) = uVar8;
              puVar12 = (undefined8 *)((long)src + lVar18 + 0x30);
              uVar8 = puVar12[1];
              *(undefined8 *)(pBVar28 + 0x10) = *puVar12;
              *(undefined8 *)(pBVar28 + 0x18) = uVar8;
              lVar18 = lVar18 + 0x20;
            } while (pBVar28 + 0x20 < pBVar7 + uVar26);
            goto LAB_001bb920;
          }
        }
        ppBVar1 = &(cctx->seqStore).lit;
        *ppBVar1 = *ppBVar1 + uVar26;
        psVar11 = (cctx->seqStore).sequences;
      }
      psVar11->litLength = (U16)uVar13;
      psVar11->offset = uVar14 + 1;
      if (0xffff < uVar24 - 3) {
        (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
        (cctx->seqStore).longLengthPos =
             (U32)((ulong)((long)psVar11 - (long)(cctx->seqStore).sequencesStart) >> 3);
      }
      uVar19 = uVar19 - uVar9;
      psVar11->matchLength = (U16)(uVar24 - 3);
      (cctx->seqStore).sequences = psVar11 + 1;
      src = (void *)((long)src + (ulong)(uVar13 + uVar24));
      uVar26 = local_68;
      iVar16 = local_6c;
      local_74 = uVar15;
    } while (uVar19 != 0);
    uVar14 = local_84;
    uVar27 = 0;
  }
LAB_001bb9d1:
  seqPos->idx = uVar15;
  seqPos->posInSequence = uVar27;
  pZVar6 = (cctx->blockState).nextCBlock;
  pZVar6->rep[2] = local_78;
  *(ulong *)pZVar6->rep = local_80;
  puVar12 = (undefined8 *)(local_48 - (ulong)uVar14);
  if ((undefined8 *)src != puVar12) {
    uVar26 = (ulong)(uint)((int)puVar12 - (int)src);
    local_58 = blockSize;
    local_40 = inSeqs;
    local_38 = inSeqsSize;
    memcpy((cctx->seqStore).lit,src,uVar26);
    ppBVar1 = &(cctx->seqStore).lit;
    *ppBVar1 = *ppBVar1 + uVar26;
    seqPos->posInSrc = seqPos->posInSrc + uVar26;
  }
  return (ulong)uVar14;
}

Assistant:

static size_t ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx* cctx, ZSTD_sequencePosition* seqPos,
                                                       const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                                       const void* src, size_t blockSize) {
    U32 idx = seqPos->idx;
    U32 startPosInSequence = seqPos->posInSequence;
    U32 endPosInSequence = seqPos->posInSequence + (U32)blockSize;
    size_t dictSize;
    BYTE const* ip = (BYTE const*)(src);
    BYTE const* iend = ip + blockSize;  /* May be adjusted if we decide to process fewer than blockSize bytes */
    repcodes_t updatedRepcodes;
    U32 bytesAdjustment = 0;
    U32 finalMatchSplit = 0;
    U32 litLength;
    U32 matchLength;
    U32 rawOffset;
    U32 offCode;

    if (cctx->cdict) {
        dictSize = cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    DEBUGLOG(5, "ZSTD_copySequencesToSeqStore: idx: %u PIS: %u blockSize: %zu", idx, startPosInSequence, blockSize);
    DEBUGLOG(5, "Start seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    while (endPosInSequence && idx < inSeqsSize && !finalMatchSplit) {
        const ZSTD_Sequence currSeq = inSeqs[idx];
        litLength = currSeq.litLength;
        matchLength = currSeq.matchLength;
        rawOffset = currSeq.offset;

        /* Modify the sequence depending on where endPosInSequence lies */
        if (endPosInSequence >= currSeq.litLength + currSeq.matchLength) {
            if (startPosInSequence >= litLength) {
                startPosInSequence -= litLength;
                litLength = 0;
                matchLength -= startPosInSequence;
            } else {
                litLength -= startPosInSequence;
            }
            /* Move to the next sequence */
            endPosInSequence -= currSeq.litLength + currSeq.matchLength;
            startPosInSequence = 0;
            idx++;
        } else {
            /* This is the final (partial) sequence we're adding from inSeqs, and endPosInSequence
               does not reach the end of the match. So, we have to split the sequence */
            DEBUGLOG(6, "Require a split: diff: %u, idx: %u PIS: %u",
                     currSeq.litLength + currSeq.matchLength - endPosInSequence, idx, endPosInSequence);
            if (endPosInSequence > litLength) {
                U32 firstHalfMatchLength;
                litLength = startPosInSequence >= litLength ? 0 : litLength - startPosInSequence;
                firstHalfMatchLength = endPosInSequence - startPosInSequence - litLength;
                if (matchLength > blockSize && firstHalfMatchLength >= cctx->appliedParams.cParams.minMatch) {
                    /* Only ever split the match if it is larger than the block size */
                    U32 secondHalfMatchLength = currSeq.matchLength + currSeq.litLength - endPosInSequence;
                    if (secondHalfMatchLength < cctx->appliedParams.cParams.minMatch) {
                        /* Move the endPosInSequence backward so that it creates match of minMatch length */
                        endPosInSequence -= cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        bytesAdjustment = cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        firstHalfMatchLength -= bytesAdjustment;
                    }
                    matchLength = firstHalfMatchLength;
                    /* Flag that we split the last match - after storing the sequence, exit the loop,
                       but keep the value of endPosInSequence */
                    finalMatchSplit = 1;
                } else {
                    /* Move the position in sequence backwards so that we don't split match, and break to store
                     * the last literals. We use the original currSeq.litLength as a marker for where endPosInSequence
                     * should go. We prefer to do this whenever it is not necessary to split the match, or if doing so
                     * would cause the first half of the match to be too small
                     */
                    bytesAdjustment = endPosInSequence - currSeq.litLength;
                    endPosInSequence = currSeq.litLength;
                    break;
                }
            } else {
                /* This sequence ends inside the literals, break to store the last literals */
                break;
            }
        }
        /* Check if this offset can be represented with a repcode */
        {   U32 ll0 = (litLength == 0);
            offCode = ZSTD_finalizeOffCode(rawOffset, updatedRepcodes.rep, ll0);
            updatedRepcodes = ZSTD_updateRep(updatedRepcodes.rep, offCode, ll0);
        }

        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offCode, matchLength, seqPos->posInSrc,
                                                   cctx->appliedParams.cParams.windowLog, dictSize,
                                                   cctx->appliedParams.cParams.minMatch),
                                                   "Sequence validation failed");
        }
        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offCode, matchLength, litLength);
        RETURN_ERROR_IF(idx - seqPos->idx > cctx->seqStore.maxNbSeq, memory_allocation,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offCode, matchLength - MINMATCH);
        ip += matchLength + litLength;
    }
    DEBUGLOG(5, "Ending seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    assert(idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength);
    seqPos->idx = idx;
    seqPos->posInSequence = endPosInSequence;
    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    iend -= bytesAdjustment;
    if (ip != iend) {
        /* Store any last literals */
        U32 lastLLSize = (U32)(iend - ip);
        assert(ip <= iend);
        DEBUGLOG(6, "Storing last literals of size: %u", lastLLSize);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, lastLLSize);
        seqPos->posInSrc += lastLLSize;
    }

    return bytesAdjustment;
}